

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O1

void __thiscall
google::
sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::move_from(sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            *this,MoveDontCopyT mover,
           sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *ht,size_type min_buckets_wanted)

{
  int *piVar1;
  uint *puVar2;
  size_type *psVar3;
  ushort uVar4;
  int iVar5;
  pointer psVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  destructive_iterator it;
  sparse_hashtable_destructive_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_c0;
  destructive_iterator local_78;
  
  clear(this);
  if (mover == MoveDontGrow) {
    uVar7 = (ht->table).settings.table_size;
  }
  else {
    uVar7 = sparsehash_internal::sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>::
            min_buckets((sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> *)this,
                        (ht->table).settings.num_buckets - ht->num_deleted,min_buckets_wanted);
  }
  if ((this->table).settings.table_size < uVar7) {
    sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::resize
              (&this->table,uVar7);
    fVar12 = (float)(this->table).settings.table_size;
    fVar13 = (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
             enlarge_factor_ * fVar12;
    uVar7 = (ulong)fVar13;
    (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
    enlarge_threshold_ = (long)(fVar13 - 9.223372e+18) & (long)uVar7 >> 0x3f | uVar7;
    fVar12 = fVar12 * (this->settings).
                      super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
                      shrink_factor_;
    uVar7 = (ulong)fVar12;
    (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
    shrink_threshold_ = (long)(fVar12 - 9.223372e+18) & (long)uVar7 >> 0x3f | uVar7;
    (this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
    consider_shrink_ = false;
  }
  destructive_begin(&local_78,ht);
  while( true ) {
    local_c0.pos.row_begin._M_current =
         (ht->table).groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_c0.pos.row_end._M_current =
         (ht->table).groups.
         super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_c0.pos.col_current = (const_reference)0x0;
    local_c0.end.col_current = (nonempty_iterator)0x0;
    local_c0.ht = ht;
    local_c0.pos.row_current._M_current = local_c0.pos.row_end._M_current;
    local_c0.end.row_begin._M_current = local_c0.pos.row_begin._M_current;
    local_c0.end.row_end._M_current = local_c0.pos.row_end._M_current;
    local_c0.end.row_current._M_current = local_c0.pos.row_end._M_current;
    sparse_hashtable_destructive_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::advance_past_deleted(&local_c0);
    if ((((local_78.pos.row_begin._M_current == local_c0.pos.row_begin._M_current) &&
         (local_78.pos.row_end._M_current == local_c0.pos.row_end._M_current)) &&
        (local_78.pos.row_current._M_current == local_c0.pos.row_current._M_current)) &&
       ((local_78.pos.row_current._M_current == local_78.pos.row_end._M_current ||
        (local_78.pos.col_current == local_c0.pos.col_current)))) break;
    iVar5 = *local_78.pos.col_current;
    piVar1 = &(this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>
              .super_TransparentHasher.super_Hasher.num_hashes_;
    *piVar1 = *piVar1 + 1;
    uVar10 = (this->table).settings.table_size - 1;
    uVar9 = -(long)iVar5 & uVar10;
    psVar6 = (this->table).groups.
             super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = uVar9 / 0x30;
    uVar7 = uVar9 % 0x30;
    if ((psVar6[uVar8].bitmap[uVar7 >> 3] >> ((uint)uVar7 & 7) & 1) != 0) {
      lVar11 = 1;
      do {
        uVar9 = uVar9 + lVar11 & uVar10;
        uVar8 = uVar9 / 0x30;
        uVar7 = uVar9 % 0x30;
        lVar11 = lVar11 + 1;
      } while ((psVar6[uVar8].bitmap[uVar7 >> 3] >> ((uint)uVar7 & 7) & 1) != 0);
    }
    uVar4 = psVar6[uVar8].settings.num_buckets;
    sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::set
              (psVar6 + uVar8,(size_type_conflict)uVar7,local_78.pos.col_current);
    psVar3 = &(this->table).settings.num_buckets;
    *psVar3 = *psVar3 + ((ulong)(this->table).groups.
                                super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar8].settings.
                                num_buckets - (ulong)uVar4);
    local_78.pos.col_current = local_78.pos.col_current + 1;
    destructive_two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
    ::advance_past_end(&local_78.pos);
    sparse_hashtable_destructive_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::advance_past_deleted(&local_78);
  }
  puVar2 = &(this->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
            num_ht_copies_;
  *puVar2 = *puVar2 + 1;
  return;
}

Assistant:

void move_from(MoveDontCopyT mover, sparse_hashtable& ht,
                 size_type min_buckets_wanted) {
    clear();  // clear table, set num_deleted to 0

    // If we need to change the size of our table, do it now
    size_type resize_to;
    if (mover == MoveDontGrow)
      resize_to = ht.bucket_count();  // keep same size as old ht
    else                              // MoveDontCopy
      resize_to = settings.min_buckets(ht.size(), min_buckets_wanted);
    if (resize_to > bucket_count()) {  // we don't have enough buckets
      table.resize(resize_to);         // sets the number of buckets
      settings.reset_thresholds(bucket_count());
    }

    // We use a normal iterator to get non-deleted bcks from ht
    // We could use insert() here, but since we know there are
    // no duplicates and no deleted items, we can be more efficient
    assert((bucket_count() & (bucket_count() - 1)) == 0);  // a power of two
    // THIS IS THE MAJOR LINE THAT DIFFERS FROM COPY_FROM():
    for (destructive_iterator it = ht.destructive_begin();
         it != ht.destructive_end(); ++it) {
      size_type num_probes = 0;  // how many times we've probed
      size_type bucknum;
      for (bucknum = hash(get_key(*it)) & (bucket_count() - 1);  // h % buck_cnt
           table.test(bucknum);                                  // not empty
           bucknum =
               (bucknum + JUMP_(key, num_probes)) & (bucket_count() - 1)) {
        ++num_probes;
        assert(num_probes < bucket_count() &&
               "Hashtable is full: an error in key_equal<> or hash<>");
      }
      table.set(bucknum, *it);  // copies the value to here
    }
    settings.inc_num_ht_copies();
  }